

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_console.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  TextAttributes *_attr;
  ostream *poVar2;
  TextAttributes local_c0;
  undefined1 local_90 [127];
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colourGuard;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    Colour::Colour(&local_11,ReconstructedExpression);
    poVar2 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_((AssertionResult *)local_90);
    Tbc::TextAttributes::TextAttributes(&local_c0);
    _attr = Tbc::TextAttributes::setIndent(&local_c0,2);
    Tbc::Text::Text((Text *)(local_90 + 0x20),(string *)local_90,_attr);
    poVar2 = Tbc::operator<<(poVar2,(Text *)(local_90 + 0x20));
    std::operator<<(poVar2,"\n");
    Tbc::Text::~Text((Text *)(local_90 + 0x20));
    std::__cxx11::string::~string((string *)local_90);
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }